

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseMaps.h
# Opt level: O1

insert_result __thiscall
tonk::
LightHashMap<asio::ip::basic_endpoint<asio::ip::udp>,_tonk::IConnection_*,_tonk::UDPAddressHasher>::
insert(LightHashMap<asio::ip::basic_endpoint<asio::ip::udp>,_tonk::IConnection_*,_tonk::UDPAddressHasher>
       *this,basic_endpoint<asio::ip::udp> *k,IConnection **v)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  uint64_t uVar6;
  ulong uVar7;
  ulong uVar8;
  raw_node *prVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  uint local_3c;
  
  if (this->m_values_count == 0) {
    bVar10 = 0;
    local_3c = 0;
    bVar5 = false;
  }
  else {
    uVar6 = HashUDPAddress(k);
    uVar12 = (uint)((int)uVar6 * -0x61c88647) >> ((byte)this->m_hash_shift & 0x1f);
    uVar8 = (ulong)uVar12;
    prVar9 = this->m_values + uVar8;
    if (this->m_values[uVar8].m_bits[0x28] == '\0') {
      local_3c = 0;
      uVar11 = uVar12;
LAB_0012b085:
      bVar10 = 0;
      bVar5 = false;
      if (this->m_num_valid < this->m_grow_threshold) {
        uVar2 = *(undefined8 *)&(k->impl_).data_;
        uVar3 = *(undefined8 *)((long)&(k->impl_).data_ + 8);
        uVar4 = *(undefined8 *)((long)&(k->impl_).data_ + 0x14);
        *(undefined8 *)((long)&((endpoint *)prVar9->m_bits)->data_ + 0xc) =
             *(undefined8 *)((long)&(k->impl_).data_ + 0xc);
        *(undefined8 *)((long)&((endpoint *)prVar9->m_bits)->data_ + 0x14) = uVar4;
        *(undefined8 *)&((endpoint *)prVar9->m_bits)->data_ = uVar2;
        *(undefined8 *)((long)&((endpoint *)prVar9->m_bits)->data_ + 8) = uVar3;
        *(IConnection **)((long)((endpoint *)prVar9->m_bits + 1) + 4) = *v;
        *(undefined1 *)((long)((endpoint *)prVar9->m_bits + 1) + 0xc) = 1;
        this->m_num_valid = this->m_num_valid + 1;
        bVar10 = 1;
        bVar5 = true;
        local_3c = uVar11;
      }
    }
    else {
      bVar5 = asio::ip::operator==((basic_endpoint<asio::ip::udp> *)prVar9,k);
      if (bVar5) {
        bVar5 = true;
        bVar10 = 0;
        local_3c = uVar12;
      }
      else {
        do {
          if ((int)uVar8 == 0) {
            uVar8 = (ulong)(this->m_values_count - 1);
            prVar9 = this->m_values + uVar8;
          }
          else {
            uVar8 = (ulong)((int)uVar8 - 1);
            prVar9 = prVar9 + -1;
          }
          uVar11 = (uint)uVar8;
          bVar1 = uVar12 != uVar11;
          if (uVar12 == uVar11) {
LAB_0012b076:
            local_3c = 0;
            bVar5 = false;
            goto LAB_0012b07a;
          }
          if (prVar9->m_bits[0x28] == '\0') {
            bVar1 = true;
            goto LAB_0012b076;
          }
          bVar5 = asio::ip::operator==((basic_endpoint<asio::ip::udp> *)prVar9,k);
        } while (!bVar5);
        bVar5 = true;
        bVar1 = false;
        local_3c = uVar11;
LAB_0012b07a:
        if (bVar1) goto LAB_0012b085;
        bVar10 = 0;
      }
    }
  }
  if (bVar5) {
    uVar8 = (ulong)local_3c;
  }
  else {
    uVar12 = this->m_values_count * 2;
    uVar11 = 4;
    if (4 < uVar12) {
      uVar11 = uVar12;
    }
    rehash(this,uVar11);
    if (this->m_values_count == 0) {
      uVar8 = (ulong)local_3c;
    }
    else {
      uVar6 = HashUDPAddress(k);
      uVar12 = (uint)((int)uVar6 * -0x61c88647) >> ((byte)this->m_hash_shift & 0x1f);
      uVar7 = (ulong)uVar12;
      prVar9 = this->m_values + uVar7;
      if (this->m_values[uVar7].m_bits[0x28] != '\0') {
        bVar5 = asio::ip::operator==((basic_endpoint<asio::ip::udp> *)prVar9,k);
        if (bVar5) {
          bVar10 = 0;
          uVar8 = uVar7;
          goto LAB_0012b1f2;
        }
        do {
          if ((int)uVar7 == 0) {
            uVar7 = (ulong)(this->m_values_count - 1);
            prVar9 = this->m_values + uVar7;
          }
          else {
            uVar7 = (ulong)((int)uVar7 - 1);
            prVar9 = prVar9 + -1;
          }
          uVar11 = (uint)uVar7;
          bVar5 = uVar12 != uVar11;
          if (uVar12 == uVar11) goto LAB_0012b1aa;
          if (prVar9->m_bits[0x28] == '\0') {
            bVar5 = true;
            goto LAB_0012b1aa;
          }
          bVar5 = asio::ip::operator==((basic_endpoint<asio::ip::udp> *)prVar9,k);
        } while (!bVar5);
        bVar10 = 0;
        bVar5 = false;
        local_3c = uVar11;
LAB_0012b1aa:
        uVar8 = (ulong)local_3c;
        if (!bVar5) goto LAB_0012b1f2;
      }
      uVar8 = (ulong)local_3c;
      if (this->m_num_valid < this->m_grow_threshold) {
        uVar2 = *(undefined8 *)&(k->impl_).data_;
        uVar3 = *(undefined8 *)((long)&(k->impl_).data_ + 8);
        uVar4 = *(undefined8 *)((long)&(k->impl_).data_ + 0x14);
        *(undefined8 *)((long)&((endpoint *)prVar9->m_bits)->data_ + 0xc) =
             *(undefined8 *)((long)&(k->impl_).data_ + 0xc);
        *(undefined8 *)((long)&((endpoint *)prVar9->m_bits)->data_ + 0x14) = uVar4;
        *(undefined8 *)&((endpoint *)prVar9->m_bits)->data_ = uVar2;
        *(undefined8 *)((long)&((endpoint *)prVar9->m_bits)->data_ + 8) = uVar3;
        *(IConnection **)((long)((endpoint *)prVar9->m_bits + 1) + 4) = *v;
        *(undefined1 *)((long)((endpoint *)prVar9->m_bits + 1) + 0xc) = 1;
        this->m_num_valid = this->m_num_valid + 1;
        bVar10 = 1;
        uVar8 = uVar7;
      }
    }
  }
LAB_0012b1f2:
  return (insert_result)(uVar8 | (ulong)bVar10 << 0x20);
}

Assistant:

inline insert_result insert(const Key& k, const Value& v = Value())
    {
        insert_result result;
        if (!insert_no_grow(result, k, v))
        {
            unsigned newSize = m_values_count * 2;
            if (newSize < cMinHashSize) {
                newSize = cMinHashSize;
            }

            rehash(newSize);

            if (!insert_no_grow(result, k, v)) {
                TONK_DEBUG_BREAK();
            }
        }

        return result;
    }